

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

string * __thiscall
flatbuffers::SimpleFloatConstantGenerator::Value
          (string *__return_storage_ptr__,SimpleFloatConstantGenerator *this,double v,string *src)

{
  string *src_local;
  double v_local;
  SimpleFloatConstantGenerator *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleFloatConstantGenerator::Value(double v,
                                                const std::string &src) const {
  (void)v;
  return src;
}